

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O2

line_type MSH::hash_line_type(string *inString)

{
  bool bVar1;
  line_type lVar2;
  
  bVar1 = std::operator==(inString,"$MeshFormat");
  if (bVar1) {
    lVar2 = eMeshFormat;
  }
  else {
    bVar1 = std::operator==(inString,"$PhysicalNames");
    if (bVar1) {
      lVar2 = ePhysicalNames;
    }
    else {
      bVar1 = std::operator==(inString,"$Nodes");
      if (bVar1) {
        lVar2 = eNodes;
      }
      else {
        bVar1 = std::operator==(inString,"$Elements");
        lVar2 = (uint)bVar1 + (uint)bVar1 * 2;
      }
    }
  }
  return lVar2;
}

Assistant:

MSH::line_type MSH::hash_line_type(std::string const& inString)
{
    if(inString == "$MeshFormat") return eMeshFormat;
    if(inString == "$PhysicalNames") return ePhysicalNames;
    if(inString == "$Nodes") return eNodes;
    if(inString == "$Elements") return eElements;
    return eDefault;
}